

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# find_all.h
# Opt level: O0

void __thiscall
wasm::FindAll<wasm::ArrayNew>::FindAll(FindAll<wasm::ArrayNew> *this,Expression *ast)

{
  undefined1 local_f8 [8];
  Finder finder;
  Expression *ast_local;
  FindAll<wasm::ArrayNew> *this_local;
  
  finder.list = (vector<wasm::GlobalGet_*,_std::allocator<wasm::GlobalGet_*>_> *)ast;
  std::vector<wasm::ArrayNew_*,_std::allocator<wasm::ArrayNew_*>_>::vector(&this->list);
  FindAll::Finder::Finder((Finder *)local_f8);
  finder.super_PostWalker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.
  super_Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.currModule = (Module *)this;
  Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::walk
            ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)local_f8,
             (Expression **)&finder.list);
  FindAll::Finder::~Finder((Finder *)local_f8);
  return;
}

Assistant:

FindAll(Expression* ast) {
    struct Finder
      : public PostWalker<Finder, UnifiedExpressionVisitor<Finder>> {
      std::vector<T*>* list;
      void visitExpression(Expression* curr) {
        if (curr->is<T>()) {
          (*list).push_back(curr->cast<T>());
        }
      }
    };
    Finder finder;
    finder.list = &list;
    finder.walk(ast);
  }